

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

uint stb_hash_fast(void *p,int len)

{
  uint uVar1;
  ushort *puVar2;
  uint uVar3;
  uint hash;
  ulong uVar4;
  uchar *q;
  
  if (p == (void *)0x0 || len < 1) {
    return 0;
  }
  puVar2 = (ushort *)p;
  uVar3 = len;
  uVar1 = len;
  if (((ulong)p & 1) == 0) {
    for (; 3 < uVar3; uVar3 = uVar3 - 4) {
      uVar1 = (uVar1 + *puVar2) * 0x10000 ^ (uint)puVar2[1] << 0xb ^ uVar1 + *puVar2;
      puVar2 = puVar2 + 2;
      uVar1 = uVar1 + (uVar1 >> 0xb);
    }
  }
  else {
    for (; 3 < uVar3; uVar3 = uVar3 - 4) {
      uVar1 = (uVar1 + *puVar2) * 0x10000 ^ (uint)puVar2[1] << 0xb ^ uVar1 + *puVar2;
      puVar2 = puVar2 + 2;
      uVar1 = uVar1 + (uVar1 >> 0xb);
    }
  }
  uVar4 = (ulong)(len & 0x7ffffffc);
  switch(len & 3) {
  case 0:
    goto switchD_0014d971_caseD_0;
  case 1:
    uVar1 = uVar1 + *(byte *)((long)p + uVar4);
    uVar1 = uVar1 * 0x400 ^ uVar1;
    uVar3 = uVar1 >> 1;
    break;
  case 2:
    uVar1 = uVar1 + *(ushort *)((long)p + uVar4);
    uVar1 = uVar1 * 0x800 ^ uVar1;
    uVar3 = uVar1 >> 0x11;
    break;
  case 3:
    uVar1 = uVar1 + *(ushort *)((long)p + uVar4);
    uVar1 = uVar1 * 0x10000 ^ (uint)*(byte *)((long)p + uVar4 + 2) << 0x12 ^ uVar1;
    uVar1 = (uVar1 >> 0xb) + uVar1;
    goto switchD_0014d971_caseD_0;
  }
  uVar1 = uVar3 + uVar1;
switchD_0014d971_caseD_0:
  uVar1 = uVar1 * 8 ^ uVar1;
  uVar1 = (uVar1 >> 5) + uVar1;
  uVar1 = uVar1 * 0x10 ^ uVar1;
  uVar1 = (uVar1 >> 0x11) + uVar1;
  uVar1 = uVar1 * 0x2000000 ^ uVar1;
  return (uVar1 >> 6) + uVar1;
}

Assistant:

unsigned int stb_hash_fast(void *p, int len)
{
   unsigned char *q = (unsigned char *) p;
   unsigned int hash = len;

   if (len <= 0 || q == NULL) return 0;

   /* Main loop */
   if (((int) q & 1) == 0) {
      for (;len > 3; len -= 4) {
         unsigned int val;
         hash +=  stb__get16(q);
         val   = (stb__get16(q+2) << 11);
         hash  = (hash << 16) ^ hash ^ val;
         q    += 4;
         hash += hash >> 11;
      }
   } else {
      for (;len > 3; len -= 4) {
         unsigned int val;
         hash +=  stb__get16_slow(q);
         val   = (stb__get16_slow(q+2) << 11);
         hash  = (hash << 16) ^ hash ^ val;
         q    += 4;
         hash += hash >> 11;
      }
   }

   /* Handle end cases */
   switch (len) {
      case 3: hash += stb__get16_slow(q);
              hash ^= hash << 16;
              hash ^= q[2] << 18;
              hash += hash >> 11;
              break;
      case 2: hash += stb__get16_slow(q);
              hash ^= hash << 11;
              hash += hash >> 17;
              break;
      case 1: hash += q[0];
              hash ^= hash << 10;
              hash += hash >> 1;
              break;
      case 0: break;
   }

   /* Force "avalanching" of final 127 bits */
   hash ^= hash << 3;
   hash += hash >> 5;
   hash ^= hash << 4;
   hash += hash >> 17;
   hash ^= hash << 25;
   hash += hash >> 6;

   return hash;
}